

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

void __thiscall dja::mat4::mat4(mat4 *this,float_t diag)

{
  vec4 *local_60;
  vec4 local_54;
  vec4 local_44;
  vec4 local_34;
  vec4 local_24;
  float_t local_14;
  mat4 *pmStack_10;
  float_t diag_local;
  mat4 *this_local;
  
  local_60 = this->m;
  local_14 = diag;
  pmStack_10 = this;
  do {
    vec4::vec4(local_60,0.0);
    local_60 = local_60 + 1;
  } while (local_60 != this[1].m);
  vec4::vec4(&local_24,local_14,0.0,0.0,0.0);
  this->m[0].x = local_24.x;
  this->m[0].y = local_24.y;
  this->m[0].z = local_24.z;
  this->m[0].w = local_24.w;
  vec4::vec4(&local_34,0.0,local_14,0.0,0.0);
  this->m[1].x = local_34.x;
  this->m[1].y = local_34.y;
  this->m[1].z = local_34.z;
  this->m[1].w = local_34.w;
  vec4::vec4(&local_44,0.0,0.0,local_14,0.0);
  this->m[2].x = local_44.x;
  this->m[2].y = local_44.y;
  this->m[2].z = local_44.z;
  this->m[2].w = local_44.w;
  vec4::vec4(&local_54,0.0,0.0,0.0,local_14);
  this->m[3].x = local_54.x;
  this->m[3].y = local_54.y;
  this->m[3].z = local_54.z;
  this->m[3].w = local_54.w;
  return;
}

Assistant:

mat4::mat4(float_t diag)
{
    m[0] = vec4(diag, 0, 0, 0);
    m[1] = vec4(0, diag, 0, 0);
    m[2] = vec4(0, 0, diag, 0);
    m[3] = vec4(0, 0, 0, diag);
}